

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macro.c
# Opt level: O1

BOOL macro_sub(List *ls,SymbolTable *sym,BOOL flag_failure)

{
  Token *original;
  TokenType TVar1;
  long lVar2;
  long *plVar3;
  SymbolInfo SVar4;
  HashErr HVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  BOOL BVar9;
  List *pLVar10;
  char *pcVar11;
  int iVar12;
  long *plVar13;
  long *plVar14;
  ListStruct *pLVar15;
  List *pLVar16;
  uint uVar17;
  char *fmt;
  undefined8 *puVar18;
  undefined8 *puVar19;
  uint uVar20;
  bool bVar21;
  SymbolInfo info;
  char buf [1024];
  SymbolInfo local_440;
  char local_438 [1032];
  
  TVar1 = (ls->token).type;
  pLVar10 = ls;
  if (TVar1 == TOK_IDENTIFIER) {
LAB_00108404:
    pcVar11 = (pLVar10->token).u.string;
    pLVar10 = (List *)0x0;
  }
  else if (TVar1 == TOK_LIST) {
    pLVar10 = ls->car;
    if (pLVar10 == (List *)0x0) {
      if (flag_failure == FALSE) {
        return FALSE;
      }
      pcVar11 = "Macro name is missing!\n";
      goto LAB_00108709;
    }
    if ((pLVar10->token).type == TOK_IDENTIFIER) goto LAB_00108404;
    pcVar11 = (char *)0x0;
  }
  else {
    pcVar11 = (char *)0x0;
  }
  HVar5 = lookup_symbol(sym,pcVar11,&local_440,(char **)0x0);
  if (HVar5 == HASH_NOTFOUND) {
    if (flag_failure == FALSE) {
      return FALSE;
    }
    if (pcVar11 == (char *)0x0) {
      if (pLVar10 == (List *)0x0) {
        pcVar11 = "Unknown operator.\n";
LAB_00108709:
        parse_error(ls,pcVar11);
        return FALSE;
      }
      pcVar11 = unparse_token(&pLVar10->token,local_438);
      fmt = "Unknown operator \"%s\"\n";
      ls = pLVar10;
    }
    else {
      fmt = "Unknown operator \"%s\".\n";
    }
  }
  else {
    original = &ls->token;
    puVar19 = (undefined8 *)0x0;
    for (SVar4 = local_440; (long *)SVar4.n != (long *)0x0;
        SVar4 = (SymbolInfo)((SymbolInfo *)(SVar4.n + 8))->p) {
      lVar2 = *SVar4.p;
      bVar21 = false;
      if (original->type == *(TokenType *)(lVar2 + 0x10)) {
        if (original->type == TOK_IDENTIFIER) {
          bVar21 = puVar19 == (undefined8 *)0x0;
        }
        else {
          uVar6 = list_length(ls->car);
          iVar7 = list_length(*(List **)(lVar2 + 8));
          plVar14 = *(long **)(lVar2 + 8);
          bVar21 = false;
          uVar17 = 0;
          plVar3 = plVar14;
          if (plVar14 != (long *)0x0) {
            do {
              plVar13 = plVar3;
              plVar3 = (long *)*plVar13;
            } while (plVar3 != (long *)0x0);
            uVar17 = (uint)((int)plVar13[2] == 0x4a);
          }
          if ((((int)uVar6 <= iVar7) || (uVar17 != 0)) && (uVar8 = iVar7 - uVar17, uVar8 <= uVar6))
          {
            pLVar15 = ls->car->cdr;
            if (pLVar15 != (ListStruct *)0x0) {
              for (puVar18 = (undefined8 *)*plVar14; puVar18 != (undefined8 *)0x0;
                  puVar18 = (undefined8 *)*puVar18) {
                if (((*(int *)(puVar18 + 2) != 0x1b) && (*(int *)(puVar18 + 2) != 0x4a)) &&
                   (BVar9 = tokens_equal(&pLVar15->token,(Token *)(puVar18 + 2)), BVar9 == FALSE))
                goto LAB_00108624;
                pLVar15 = pLVar15->cdr;
                if (pLVar15 == (ListStruct *)0x0) break;
              }
            }
            if (puVar19 == (undefined8 *)0x0) {
              bVar21 = true;
            }
            else {
              plVar14 = (long *)**(long **)(lVar2 + 8);
              iVar7 = 0;
              iVar12 = 0;
              if (plVar14 != (long *)0x0) {
                iVar12 = 0;
                do {
                  if (((int)plVar14[2] != 0x1b) && ((int)plVar14[2] != 0x4a)) {
                    iVar12 = iVar12 + 1;
                  }
                  plVar14 = (long *)*plVar14;
                } while (plVar14 != (long *)0x0);
              }
              pLVar10 = (List *)puVar19[1];
              pLVar15 = pLVar10->cdr;
              if (pLVar15 != (ListStruct *)0x0) {
                iVar7 = 0;
                do {
                  TVar1 = (pLVar15->token).type;
                  if ((TVar1 != TOK_IDENTIFIER) && (TVar1 != TOK_TAIL)) {
                    iVar7 = iVar7 + 1;
                  }
                  pLVar15 = pLVar15->cdr;
                } while (pLVar15 != (ListStruct *)0x0);
              }
              pLVar15 = pLVar10;
              if (iVar12 == iVar7) {
                do {
                  pLVar16 = pLVar15;
                  pLVar15 = pLVar16->cdr;
                } while (pLVar15 != (ListStruct *)0x0);
                bVar21 = (pLVar16->token).type == TOK_TAIL;
                iVar7 = list_length(pLVar10);
                uVar20 = (uint)bVar21;
                uVar6 = iVar7 - uVar20;
                if (uVar8 == uVar6) {
                  bVar21 = uVar17 != uVar20 && bVar21;
                }
                else {
                  bVar21 = uVar6 < uVar8;
                }
              }
              else {
                bVar21 = iVar7 < iVar12;
              }
            }
          }
        }
      }
LAB_00108624:
      if (bVar21) {
        puVar19 = *SVar4.p;
      }
    }
    if (puVar19 != (undefined8 *)0x0) {
      pLVar10 = (List *)*puVar19;
      if (original->type == TOK_LIST) {
        pLVar10 = copy_list(pLVar10);
        substitute_args(ls->car->cdr,*(List **)puVar19[1],pLVar10);
      }
      else {
        if (pLVar10 == (List *)0x0) {
          original->type = TOK_EMPTY;
          return TRUE;
        }
        if ((pLVar10->cdr == (ListStruct *)0x0) &&
           (TVar1 = (pLVar10->token).type, TVar1 != TOK_LIST)) {
          (ls->token).type = TVar1;
          (ls->token).u = (pLVar10->token).u;
          return TRUE;
        }
        pLVar10 = copy_list(pLVar10);
        propagate_fileinfo(original,pLVar10);
      }
      replace_list(ls,pLVar10);
      return TRUE;
    }
    if (flag_failure == FALSE) {
      return FALSE;
    }
    fmt = "No applicable version of the \"%s\" macro exists for these arguments.\n";
  }
  parse_error(ls,fmt,pcVar11);
  return FALSE;
}

Assistant:

BOOL
macro_sub (List *ls, const SymbolTable *sym, BOOL flag_failure)
{
  const Macro *m;
  List *best = NULL, *new, *op;
  SymbolInfo info;
  const char *name;

#ifdef DEBUG
  printf ("macro_sub: "); print_list (ls, stdout); putchar ('\n');
#endif


  /* Get the name of the macro to be expanded. */
  op = NULL;
  if (ls->token.type == TOK_LIST)
    {
      if (ls->car == NULL)
	{
	  if (flag_failure)
	    parse_error (ls, "Macro name is missing!\n");
	  return FALSE;
	}
      if (ls->car->token.type == TOK_IDENTIFIER)
	name = ls->car->token.u.string;
      else
	{
	  op = ls->car;
	  name = NULL;
	}
    }
  else if (ls->token.type == TOK_IDENTIFIER)
    name = ls->token.u.string;
  else
    {
      op = ls;
      name = NULL;
    }

  /* Look up the macro list in the symbol table. */
  if (lookup_symbol (sym, name, &info, NULL) == HASH_NOTFOUND)
    {
      if (flag_failure)
	{
	  char buf[1024];
	  if (name == NULL)
	    {
	      if (op != NULL)
		parse_error (op, "Unknown operator \"%s\"\n",
			     unparse_token (&op->token, buf));
	      else
		parse_error (ls, "Unknown operator.\n");
	    }
	  else
	    parse_error (ls, "Unknown operator \"%s\".\n", name);
	}
      return FALSE;
    }
  m = (const Macro *) info.p;


  /* Now we have a list of macros and we have to choose the best match by the
   * following heuristics, in order:
   *  (1) Invocation form matching.  "foo" and "(foo)" can only match
   *      (define foo ...) and (define (foo) ...), respectively.
   *  (2) The number of arguments must match.  Note that the "+tail" construct
   *      can allow an arbitrarily high number of arguments.
   *  (3) All literals must match (see 3, below)
   *  (4) Number of literal matches.  For example, it is legal to both
   *      (define (foo a1 a2 0) x) and (define (foo a1 a2 a3) y).  In this
   *      example, an invocation of (foo 2 1 0) would expand to x.
   *  (5) Larger number of arguments.  Whichever macro names the most arguments
   *      (disregarding any "+tail", of course) will be preferred.
   *  (6) Prefer the macro without a "+tail".
   *  (7) Lexical predecence.  In case of a tie, the first macro defined will
   *      be chosen.
   */

  /* Find the best match. */
  for (best = NULL; m != NULL; m = m->next)
    if (better_match (ls, m->expr, best))
      best = m->expr;

  /* Was there no match at all? */
  if (best == NULL)
    {
      if (flag_failure)
	parse_error (ls, "No applicable version of the \"%s\" macro exists "
		     "for these arguments.\n", name);
      return FALSE;
    }

  /* Is this simple substitution (ie, no macro arguments, etc.) */
  if (ls->token.type != TOK_LIST)
    {
      if (best->cdr == NULL)  /* Empty list? */
	ls->token.type = TOK_EMPTY;
      else if (CDDR (best) == NULL && best->cdr->token.type != TOK_LIST)
	{
	  ls->token.type = best->cdr->token.type;
	  ls->token.u    = best->cdr->token.u;
	}
      else
	{
	  new = copy_list (best->cdr);
	  propagate_fileinfo (&ls->token, new);  /* So we don't forget... */
	  replace_list (ls, new);
	}

      return TRUE;
    }

  /* It's a complicate macro with arguments.  Substitute in the arguments. */
  new = copy_list (best->cdr);
  substitute_args (CDAR (ls), CDAR (best), new);
  replace_list (ls, new);

  return TRUE;
}